

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  Breakpoint *pBVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  BreakpointSource BVar6;
  int iVar7;
  BreakpointSource BVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Breakpoint *pBVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Breakpoint tmp;
  
  if (end <= start + 1) {
    return;
  }
  iVar18 = end + -1;
LAB_0020a528:
  uVar9 = iVar18 - start;
  if ((int)uVar9 < 0x19) {
    if ((int)uVar9 < 1) {
      return;
    }
    SPxShellsort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (keys,iVar18,compare,start);
    return;
  }
  iVar10 = (uVar9 >> 1) + start;
  pBVar1 = keys + iVar10;
  dVar3 = keys[iVar10].val;
  lVar11 = (long)iVar18;
  lVar12 = (long)start;
  iVar10 = iVar18;
  iVar16 = start;
LAB_0020a557:
  lVar15 = (long)iVar16;
  iVar17 = iVar18;
  if (iVar18 < iVar16) {
    iVar17 = iVar16;
  }
  if ((type & 1U) == 0) {
    lVar14 = (long)iVar10;
    pBVar13 = keys + lVar15;
    for (; lVar15 < lVar11; lVar15 = lVar15 + 1) {
      dVar4 = pBVar13->val;
      if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (0.0 < dVar4 - dVar3)) {
        iVar17 = (int)lVar15;
        break;
      }
      pBVar13 = pBVar13 + 1;
    }
    if (start <= iVar10) {
      iVar10 = start;
    }
    pBVar13 = keys + lVar14;
    for (; lVar12 < lVar14; lVar14 = lVar14 + -1) {
      if (pBVar13->val <= dVar3) goto LAB_0020a622;
      pBVar13 = pBVar13 + -1;
    }
  }
  else {
    pBVar13 = keys + lVar15;
    for (; lVar15 < lVar11; lVar15 = lVar15 + 1) {
      if (dVar3 < pBVar13->val || dVar3 == pBVar13->val) {
        iVar17 = (int)lVar15;
        break;
      }
      pBVar13 = pBVar13 + 1;
    }
    lVar14 = (long)iVar10;
    if (start <= iVar10) {
      iVar10 = start;
    }
    pBVar13 = keys + lVar14;
    for (; lVar12 < lVar14; lVar14 = lVar14 + -1) {
      dVar4 = pBVar13->val;
      if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (dVar4 - dVar3 < 0.0))
      goto LAB_0020a622;
      pBVar13 = pBVar13 + -1;
    }
  }
  goto LAB_0020a625;
LAB_0020a622:
  iVar10 = (int)lVar14;
LAB_0020a625:
  if (iVar10 <= iVar17) goto LAB_0020a660;
  pBVar13 = keys + iVar17;
  dVar4 = pBVar13->val;
  iVar7 = pBVar13->idx;
  BVar8 = pBVar13->src;
  pBVar13 = keys + iVar10;
  iVar16 = pBVar13->idx;
  BVar6 = pBVar13->src;
  pBVar2 = keys + iVar17;
  pBVar2->val = pBVar13->val;
  pBVar2->idx = iVar16;
  pBVar2->src = BVar6;
  pBVar13 = keys + iVar10;
  pBVar13->val = dVar4;
  pBVar13->idx = iVar7;
  pBVar13->src = BVar8;
  iVar16 = iVar17 + 1;
  iVar10 = iVar10 + -1;
  goto LAB_0020a557;
LAB_0020a660:
  if ((type & 1U) == 0) {
    lVar15 = (long)iVar10;
    if (start <= iVar10) {
      iVar10 = start;
    }
    pBVar13 = keys + lVar15;
    for (; lVar12 < lVar15; lVar15 = lVar15 + -1) {
      dVar4 = pBVar13->val;
      if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (0.0 < dVar3 - dVar4)) {
        iVar10 = (int)lVar15;
        break;
      }
      pBVar13 = pBVar13 + -1;
    }
    if (iVar10 == iVar18) {
      pBVar13 = keys + lVar11;
      dVar3 = pBVar13->val;
      iVar16 = pBVar13->idx;
      BVar8 = pBVar13->src;
      iVar10 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar13 = keys + lVar11;
      pBVar13->val = pBVar1->val;
      pBVar13->idx = iVar10;
      pBVar13->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar16;
      pBVar1->src = BVar8;
      iVar10 = iVar18 + -1;
    }
  }
  else {
    lVar15 = (long)iVar17;
    if (iVar17 <= iVar18) {
      iVar17 = iVar18;
    }
    pBVar13 = keys + lVar15;
    for (; lVar15 < lVar11; lVar15 = lVar15 + 1) {
      dVar4 = pBVar13->val;
      if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (dVar3 - dVar4 < 0.0)) {
        iVar17 = (int)lVar15;
        break;
      }
      pBVar13 = pBVar13 + 1;
    }
    if (iVar17 == start) {
      pBVar13 = keys + lVar12;
      dVar3 = pBVar13->val;
      iVar17 = pBVar13->idx;
      BVar8 = pBVar13->src;
      iVar16 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar13 = keys + lVar12;
      pBVar13->val = pBVar1->val;
      pBVar13->idx = iVar16;
      pBVar13->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar17;
      pBVar1->src = BVar8;
      iVar17 = start + 1;
    }
  }
  if (iVar18 - iVar17 < iVar10 - start) {
    bVar5 = iVar18 <= iVar17;
    iVar16 = iVar10;
    iVar10 = iVar18;
    iVar18 = iVar17;
    iVar17 = start;
    if (bVar5) goto LAB_0020a77c;
  }
  else {
    bVar5 = iVar10 <= start;
    iVar16 = iVar18;
    iVar18 = start;
    start = iVar17;
    if (bVar5) goto LAB_0020a77c;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
            (keys,iVar10 + 1,compare,iVar18,(bool)(~type & 1));
  start = iVar17;
LAB_0020a77c:
  iVar18 = iVar16;
  type = (bool)(type ^ 1);
  goto LAB_0020a528;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}